

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualpage.cpp
# Opt level: O0

void __thiscall sai::VirtualPage::DecryptData(VirtualPage *this,uint32_t PageChecksum)

{
  value_type_conflict1 vVar1;
  value_type_conflict1 vVar2;
  value_type_conflict1 vVar3;
  value_type_conflict1 vVar4;
  iterator pvVar5;
  const_reference pvVar6;
  uint32_t LastData;
  uint32_t *CurData;
  iterator __end1;
  iterator __begin1;
  array<unsigned_int,_1024UL> *__range1;
  uint32_t PrevData;
  uint32_t PageChecksum_local;
  VirtualPage *this_local;
  
  __end1 = std::array<unsigned_int,_1024UL>::begin((array<unsigned_int,_1024UL> *)this);
  pvVar5 = std::array<unsigned_int,_1024UL>::end((array<unsigned_int,_1024UL> *)this);
  __range1._0_4_ = PageChecksum;
  for (; __end1 != pvVar5; __end1 = __end1 + 1) {
    vVar1 = *__end1;
    pvVar6 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,(ulong)((uint32_t)__range1 >> 0x18)
                       );
    vVar2 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((uint32_t)__range1 >> 0x10 & 0xff));
    vVar3 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,
                        (ulong)((uint32_t)__range1 >> 8 & 0xff));
    vVar4 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_256UL>::operator[]
                       ((array<unsigned_int,_256UL> *)Keys::User,(ulong)((uint32_t)__range1 & 0xff))
    ;
    *__end1 = *__end1 - ((uint32_t)__range1 ^ vVar2 + vVar3 + vVar4 + *pvVar6);
    __range1._0_4_ = vVar1;
  }
  return;
}

Assistant:

void VirtualPage::DecryptData(std::uint32_t PageChecksum)
{
	std::uint32_t PrevData = PageChecksum;
#if defined(__AVX2__)
	__m256i PrevData8 = _mm256_set1_epi32(PrevData);
	for( std::size_t i = 0; i < (PageSize / sizeof(std::uint32_t)); i += 8 )
	{
		const __m256i CurData8 = _mm256_loadu_si256((__m256i*)(u32 + i));
		// There is no true _mm_alignr_epi8 for AVX2
		// An extra _mm256_permute2x128_si256 is needed
		PrevData8 = _mm256_alignr_epi8(
			CurData8, _mm256_permute2x128_si256(PrevData8, CurData8, _MM_SHUFFLE(0, 2, 0, 1)),
			sizeof(std::uint32_t) * 3
		);
		__m256i CurPlain8 = _mm256_sub_epi32(
			CurData8, _mm256_xor_si256(PrevData8, KeySum8(PrevData8, Keys::User))
		);
		_mm256_storeu_si256((__m256i*)(u32 + i), CurPlain8);
		PrevData8 = CurData8;
	};
#else
	for( std::uint32_t& CurData : u32 )
	{
		const std::uint32_t LastData = CurData;
		CurData -= PrevData
				 ^ (Keys::User[(PrevData >> 24) & 0xFF] + Keys::User[(PrevData >> 16) & 0xFF]
					+ Keys::User[(PrevData >> 8) & 0xFF] + Keys::User[(PrevData >> 0) & 0xFF]);
		PrevData = LastData;
	}
#endif
}